

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::LinkerEnforcesNoAllowShLibUndefined(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  bool bVar2;
  cmValue __lhs;
  string linkerIdVar;
  string ll;
  string local_50;
  string local_30;
  
  GetLinkerLanguage(&local_30,this,config);
  cmStrCat<char_const(&)[7],std::__cxx11::string&,char_const(&)[20]>
            (&local_50,(char (*) [7])0x695e73,&local_30,(char (*) [20])"_COMPILER_LINKER_ID");
  __lhs = cmMakefile::GetDefinition(this->Makefile,&local_50);
  if (__lhs.Value == (string *)0x0) {
    bVar2 = false;
  }
  else {
    bVar1 = std::operator==(__lhs.Value,"GNU");
    bVar2 = true;
    if (!bVar1) {
      bVar2 = std::operator==(__lhs.Value,"Solaris");
    }
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar2;
}

Assistant:

bool cmGeneratorTarget::LinkerEnforcesNoAllowShLibUndefined(
  std::string const& config) const
{
  // FIXME(#25486): Account for the LINKER_TYPE target property.
  // Also factor out the hard-coded list below into a platform
  // information table based on the linker id.
  std::string ll = this->GetLinkerLanguage(config);
  std::string linkerIdVar = cmStrCat("CMAKE_", ll, "_COMPILER_LINKER_ID");
  cmValue linkerId = this->Makefile->GetDefinition(linkerIdVar);
  // The GNU bfd-based linker may enforce '--no-allow-shlib-undefined'
  // recursively by default.  The Solaris linker has similar behavior.
  return linkerId && (*linkerId == "GNU" || *linkerId == "Solaris");
}